

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void gen_spr_7xx(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  _spr_register(env,0x3f5,"DABR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f2,"IABR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3fb,"ICTC",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3b8,"MMCR0",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3bc,"MMCR1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3b9,"PMC1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3ba,"PMC2",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3bd,"PMC3",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3be,"PMC4",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3bb,"SIAR",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                spr_read_generic,spr_noaccess,0);
  _spr_register(env,0x3a8,"UMMCR0",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x3ac,"UMMCR1",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x3a9,"UPMC1",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x3aa,"UPMC2",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x3ad,"UPMC3",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x3ae,"UPMC4",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x3ab,"USIAR",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x11a,"EAR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  return;
}

Assistant:

static void gen_spr_7xx(CPUPPCState *env)
{
    /* Breakpoints */
    /* XXX : not implemented */
    spr_register_kvm(env, SPR_DABR, "DABR",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_DABR, 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_IABR, "IABR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Cache management */
    /* XXX : not implemented */
    spr_register(env, SPR_ICTC, "ICTC",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Performance monitors */
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_MMCR0, "MMCR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_MMCR1, "MMCR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC1, "PMC1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC2, "PMC2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC3, "PMC3",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_PMC4, "PMC4",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_SIAR, "SIAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UMMCR0, "UMMCR0",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UMMCR1, "UMMCR1",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC1, "UPMC1",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC2, "UPMC2",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC3, "UPMC3",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_UPMC4, "UPMC4",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_7XX_USIAR, "USIAR",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* External access control */
    /* XXX : not implemented */
    spr_register(env, SPR_EAR, "EAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}